

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall capnp::LocalCallContext::~LocalCallContext(LocalCallContext *this)

{
  LocalCallContext *this_local;
  
  kj::Maybe<kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t>_>::~Maybe
            (&this->tailCallPipelineFulfiller);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&this->clientRef);
  kj::Maybe<capnp::Response<capnp::AnyPointer>_>::~Maybe(&this->response);
  kj::Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_>::~Maybe(&this->request);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  ResponseHook::~ResponseHook(&this->super_ResponseHook);
  return;
}

Assistant:

class LocalCallContext final: public CallContextHook, public ResponseHook, public kj::Refcounted {
public:
  LocalCallContext(kj::Own<MallocMessageBuilder>&& request, kj::Own<ClientHook> clientRef,
                   ClientHook::CallHints hints, bool isStreaming)
      : request(kj::mv(request)), clientRef(kj::mv(clientRef)), hints(hints),
        isStreaming(isStreaming) {}

  AnyPointer::Reader getParams() override {
    KJ_IF_SOME(r, request) {
      return r.get()->getRoot<AnyPointer>();
    } else {
      KJ_FAIL_REQUIRE("Can't call getParams() after releaseParams().");
    }
  }
  void releaseParams() override {
    request = kj::none;
  }